

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

int ftp_domore_getsock(Curl_easy *data,connectdata *conn,curl_socket_t *socks)

{
  char *local_40;
  ftp_conn *ftpc;
  curl_socket_t *socks_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
      (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) &&
     (0 < Curl_trc_feat_ftp.log_level)) {
    if ((data == (Curl_easy *)0x0) || (data->conn == (connectdata *)0x0)) {
      local_40 = "???";
    }
    else {
      local_40 = ftp_state_names[(data->conn->proto).ftpc.state];
    }
    Curl_trc_ftp(data,"[%s] ftp_domore_getsock()",local_40);
  }
  if ((conn->proto).ftpc.state == '\0') {
    *socks = conn->sock[0];
    data_local._4_4_ = 1;
  }
  else {
    data_local._4_4_ = Curl_pp_getsock(data,&(conn->proto).ftpc.pp,socks);
  }
  return data_local._4_4_;
}

Assistant:

static int ftp_domore_getsock(struct Curl_easy *data,
                              struct connectdata *conn, curl_socket_t *socks)
{
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  (void)data;

  /* When in DO_MORE state, we could be either waiting for us to connect to a
   * remote site, or we could wait for that site to connect to us. Or just
   * handle ordinary commands.
   */
  CURL_TRC_FTP(data, "[%s] ftp_domore_getsock()", FTP_DSTATE(data));

  if(FTP_STOP == ftpc->state) {
    /* if stopped and still in this state, then we are also waiting for a
       connect on the secondary connection */
    DEBUGASSERT(conn->sock[SECONDARYSOCKET] != CURL_SOCKET_BAD ||
               (conn->cfilter[SECONDARYSOCKET] &&
                !Curl_conn_is_connected(conn, SECONDARYSOCKET)));
    socks[0] = conn->sock[FIRSTSOCKET];
    /* An unconnected SECONDARY will add its socket by itself
     * via its adjust_pollset() */
    return GETSOCK_READSOCK(0);
  }
  return Curl_pp_getsock(data, &conn->proto.ftpc.pp, socks);
}